

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottie2gif.cpp
# Opt level: O0

int __thiscall App::setup(App *this,int argc,char **argv,size_t *width,size_t *height)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  pointer __resolved;
  long *in_RCX;
  long in_RDX;
  int in_ESI;
  char *in_RDI;
  long *in_R8;
  array<char,_5000UL> memory;
  char *x;
  char tmp [20];
  char *path;
  undefined1 local_1440 [56];
  string local_1408 [48];
  App *in_stack_ffffffffffffec28;
  char local_58 [32];
  char *local_38;
  long *local_30;
  long *local_28;
  long local_20;
  int local_14;
  int local_4;
  
  local_38 = (char *)0x0;
  *in_R8 = 200;
  *in_RCX = 200;
  if (1 < in_ESI) {
    local_38 = *(char **)(in_RDX + 8);
  }
  local_20 = in_RDX;
  local_14 = in_ESI;
  if ((2 < in_ESI) &&
     (local_30 = in_R8, local_28 = in_RCX, pcVar3 = strstr(*(char **)(in_RDX + 0x10),"x"),
     pcVar3 != (char *)0x0)) {
    snprintf(local_58,(size_t)(pcVar3 + (1 - *(long *)(local_20 + 0x10))),"%s",
             *(undefined8 *)(local_20 + 0x10));
    iVar2 = atoi(local_58);
    *local_28 = (long)iVar2;
    snprintf(local_58,0x14,"%s",pcVar3 + 1);
    iVar2 = atoi(local_58);
    *local_30 = (long)iVar2;
  }
  if (3 < local_14) {
    lVar4 = strtol(*(char **)(local_20 + 0x18),(char **)0x0,0x10);
    *(int *)in_RDI = (int)lVar4;
  }
  pcVar3 = local_38;
  if (local_38 == (char *)0x0) {
    local_4 = help((App *)0x106cff);
  }
  else {
    __resolved = std::array<char,_5000UL>::data((array<char,_5000UL> *)0x106d25);
    pcVar3 = realpath(pcVar3,__resolved);
    local_38 = pcVar3;
    if (pcVar3 == (char *)0x0) {
      local_4 = help((App *)0x106d4f);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1408,pcVar3,(allocator *)(local_1440 + 0x37));
      std::__cxx11::string::operator=((string *)(in_RDI + 8),local_1408);
      std::__cxx11::string::~string(local_1408);
      std::allocator<char>::~allocator((allocator<char> *)(local_1440 + 0x37));
      bVar1 = jsonFile(in_stack_ffffffffffffec28);
      if (bVar1) {
        __xpg_basename((App *)local_1440,in_RDI);
        std::__cxx11::string::operator=((string *)(in_RDI + 0x28),(string *)local_1440);
        std::__cxx11::string::~string((string *)local_1440);
        std::__cxx11::string::append(in_RDI + 0x28);
        local_4 = 0;
      }
      else {
        local_4 = help((App *)0x106dcc);
      }
    }
  }
  return local_4;
}

Assistant:

int setup(int argc, char **argv, size_t *width, size_t *height)
    {
        char *path{nullptr};

        *width = *height = 200;   //default gif size

        if (argc > 1) path = argv[1];
        if (argc > 2) {
            char tmp[20];
            char *x = strstr(argv[2], "x");
            if (x) {
                snprintf(tmp, x - argv[2] + 1, "%s", argv[2]);
                *width = atoi(tmp);
                snprintf(tmp, sizeof(tmp), "%s", x + 1);
                *height = atoi(tmp);
            }
        }
        if (argc > 3) bgColor = strtol(argv[3], NULL, 16);

        if (!path) return help();

        std::array<char, 5000> memory;

#ifdef _WIN32
        path = _fullpath(memory.data(), path, memory.size());
#else
        path = realpath(path, memory.data());
#endif
        if (!path) return help();

        fileName = std::string(path);

        if (!jsonFile()) return help();

        gifName = basename(fileName);
        gifName.append(".gif");
        return 0;
    }